

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

void Fra_SmlAssignDist1(Fra_Sml_t *p,uint *pPat)

{
  uint *puVar1;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  Aig_Man_t *pAVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  
  iVar12 = p->nFrames;
  if (iVar12 < 1) {
    __assert_fail("p->nFrames > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x1b5,"void Fra_SmlAssignDist1(Fra_Sml_t *, unsigned int *)");
  }
  if (iVar12 == 1) {
    uVar6 = 0;
    while( true ) {
      p_00 = p->pAig->vCis;
      if (p_00->nSize <= (int)uVar6) break;
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_00,uVar6);
      Fra_SmlAssignConst(p,pAVar2,(uint)((pPat[uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0),0);
      uVar6 = uVar6 + 1;
    }
    uVar6 = p->pAig->nObjs[2];
    uVar11 = p->nWordsTotal * 0x20 - 1;
    if ((int)uVar6 < (int)uVar11) {
      uVar11 = uVar6;
    }
    uVar6 = 0;
    if ((int)uVar11 < 1) {
      uVar11 = 0;
    }
    while (uVar11 != uVar6) {
      pvVar3 = Vec_PtrEntry(p->pAig->vCis,uVar6);
      uVar6 = uVar6 + 1;
      puVar1 = (uint *)((long)&p[1].pAig +
                       (ulong)(uVar6 >> 5) * 4 +
                       (long)p->nWordsTotal * (long)*(int *)((long)pvVar3 + 0x24) * 4);
      *puVar1 = *puVar1 ^ 1 << ((byte)uVar6 & 0x1f);
    }
  }
  else {
    pAVar4 = p->pAig;
    iVar5 = pAVar4->nRegs;
    iVar10 = pAVar4->nObjs[2];
    iVar8 = iVar10 - iVar5;
    iVar9 = 0;
    for (iVar7 = 0; iVar7 < iVar12; iVar7 = iVar7 + 1) {
      iVar12 = 0;
      while( true ) {
        iVar5 = pAVar4->nRegs;
        iVar10 = pAVar4->nObjs[2];
        if (iVar10 - iVar5 <= iVar12) break;
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAVar4->vCis,iVar12);
        Fra_SmlAssignConst(p,pAVar2,(uint)((pPat[iVar9 + iVar12 >> 5] >> (iVar9 + iVar12 & 0x1fU) &
                                           1) != 0),iVar7);
        iVar12 = iVar12 + 1;
        pAVar4 = p->pAig;
      }
      iVar12 = p->nFrames;
      iVar9 = iVar9 + iVar8;
    }
    iVar12 = 0;
    while( true ) {
      iVar7 = iVar12 + (iVar10 - iVar5);
      if (pAVar4->vCis->nSize <= iVar7) break;
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAVar4->vCis,iVar7);
      uVar6 = p->nFrames * iVar8 + iVar12;
      Fra_SmlAssignConst(p,pAVar2,(uint)((pPat[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0),0);
      pAVar4 = p->pAig;
      iVar12 = iVar12 + 1;
    }
  }
  return;
}

Assistant:

void Fra_SmlAssignDist1( Fra_Sml_t * p, unsigned * pPat )
{
    Aig_Obj_t * pObj;
    int f, i, k, Limit, nTruePis;
    assert( p->nFrames > 0 );
    if ( p->nFrames == 1 )
    {
        // copy the PI info 
        Aig_ManForEachCi( p->pAig, pObj, i )
            Fra_SmlAssignConst( p, pObj, Abc_InfoHasBit(pPat, i), 0 );
        // flip one bit
        Limit = Abc_MinInt( Aig_ManCiNum(p->pAig), p->nWordsTotal * 32 - 1 );
        for ( i = 0; i < Limit; i++ )
            Abc_InfoXorBit( Fra_ObjSim( p, Aig_ManCi(p->pAig,i)->Id ), i+1 );
    }
    else
    {
        int fUseDist1 = 0;

        // copy the PI info for each frame
        nTruePis = Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig);
        for ( f = 0; f < p->nFrames; f++ )
            Aig_ManForEachPiSeq( p->pAig, pObj, i )
                Fra_SmlAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * f + i), f );
        // copy the latch info 
        k = 0;
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_SmlAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * p->nFrames + k++), 0 );
//        assert( p->pManFraig == NULL || nTruePis * p->nFrames + k == Aig_ManCiNum(p->pManFraig) );

        // flip one bit of the last frame
        if ( fUseDist1 ) //&& p->nFrames == 2 )
        {
            Limit = Abc_MinInt( nTruePis, p->nWordsFrame * 32 - 1 );
            for ( i = 0; i < Limit; i++ )
                Abc_InfoXorBit( Fra_ObjSim( p, Aig_ManCi(p->pAig, i)->Id ) + p->nWordsFrame*(p->nFrames-1), i+1 );
        }
    }
}